

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O0

optional<cmUVJobServerClient> __thiscall
cmUVJobServerClient::Connect
          (cmUVJobServerClient *this,uv_loop_t *loop,function<void_()> *onToken,
          function<void_(int)> *onDisconnect)

{
  bool bVar1;
  pointer pIVar2;
  undefined8 extraout_RDX;
  optional<cmUVJobServerClient> oVar3;
  unique_ptr<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_> local_50;
  cmUVJobServerClient local_48 [3];
  undefined1 local_30 [8];
  __single_object impl;
  function<void_(int)> *onDisconnect_local;
  function<void_()> *onToken_local;
  uv_loop_t *loop_local;
  
  impl._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::ImplPosix,_std::default_delete<(anonymous_namespace)::ImplPosix>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::ImplPosix_*,_std::default_delete<(anonymous_namespace)::ImplPosix>_>
  .super__Head_base<0UL,_(anonymous_namespace)::ImplPosix_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::ImplPosix,_std::default_delete<(anonymous_namespace)::ImplPosix>,_true,_true>
        )(__uniq_ptr_data<(anonymous_namespace)::ImplPosix,_std::default_delete<(anonymous_namespace)::ImplPosix>,_true,_true>
          )onDisconnect;
  std::make_unique<(anonymous_namespace)::ImplPosix,uv_loop_s&>((uv_loop_s *)local_30);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_30);
  if (bVar1) {
    pIVar2 = std::
             unique_ptr<(anonymous_namespace)::ImplPosix,_std::default_delete<(anonymous_namespace)::ImplPosix>_>
             ::operator->((unique_ptr<(anonymous_namespace)::ImplPosix,_std::default_delete<(anonymous_namespace)::ImplPosix>_>
                           *)local_30);
    bVar1 = anon_unknown.dwarf_35d814::ImplPosix::IsConnected(pIVar2);
    if (bVar1) {
      pIVar2 = std::
               unique_ptr<(anonymous_namespace)::ImplPosix,_std::default_delete<(anonymous_namespace)::ImplPosix>_>
               ::operator->((unique_ptr<(anonymous_namespace)::ImplPosix,_std::default_delete<(anonymous_namespace)::ImplPosix>_>
                             *)local_30);
      std::function<void_()>::operator=(&(pIVar2->super_Impl).OnToken,onToken);
      pIVar2 = std::
               unique_ptr<(anonymous_namespace)::ImplPosix,_std::default_delete<(anonymous_namespace)::ImplPosix>_>
               ::operator->((unique_ptr<(anonymous_namespace)::ImplPosix,_std::default_delete<(anonymous_namespace)::ImplPosix>_>
                             *)local_30);
      std::function<void_(int)>::operator=(&(pIVar2->super_Impl).OnDisconnect,onDisconnect);
      std::unique_ptr<cmUVJobServerClient::Impl,std::default_delete<cmUVJobServerClient::Impl>>::
      unique_ptr<(anonymous_namespace)::ImplPosix,std::default_delete<(anonymous_namespace)::ImplPosix>,void>
                ((unique_ptr<cmUVJobServerClient::Impl,std::default_delete<cmUVJobServerClient::Impl>>
                  *)&local_50,
                 (unique_ptr<(anonymous_namespace)::ImplPosix,_std::default_delete<(anonymous_namespace)::ImplPosix>_>
                  *)local_30);
      cmUVJobServerClient(local_48,&local_50);
      std::optional<cmUVJobServerClient>::optional<cmUVJobServerClient,_true>
                ((optional<cmUVJobServerClient> *)this,local_48);
      ~cmUVJobServerClient(local_48);
      std::unique_ptr<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>::
      ~unique_ptr(&local_50);
      goto LAB_003058bb;
    }
  }
  std::optional<cmUVJobServerClient>::optional((optional<cmUVJobServerClient> *)this);
LAB_003058bb:
  std::
  unique_ptr<(anonymous_namespace)::ImplPosix,_std::default_delete<(anonymous_namespace)::ImplPosix>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::ImplPosix,_std::default_delete<(anonymous_namespace)::ImplPosix>_>
                 *)local_30);
  oVar3.super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
  super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
  super__Optional_payload_base<cmUVJobServerClient>._8_8_ = extraout_RDX;
  oVar3.super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
  super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
  super__Optional_payload_base<cmUVJobServerClient>._M_payload =
       (_Storage<cmUVJobServerClient,_false>)this;
  return (optional<cmUVJobServerClient>)
         oVar3.super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
         super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
         super__Optional_payload_base<cmUVJobServerClient>;
}

Assistant:

cm::optional<cmUVJobServerClient> cmUVJobServerClient::Connect(
  uv_loop_t& loop, std::function<void()> onToken,
  std::function<void(int)> onDisconnect)
{
#if defined(_WIN32)
  // FIXME: Windows job server client not yet implemented.
  static_cast<void>(loop);
  static_cast<void>(onToken);
  static_cast<void>(onDisconnect);
#else
  auto impl = cm::make_unique<ImplPosix>(loop);
  if (impl && impl->IsConnected()) {
    impl->OnToken = std::move(onToken);
    impl->OnDisconnect = std::move(onDisconnect);
    return cmUVJobServerClient(std::move(impl));
  }
#endif
  return cm::nullopt;
}